

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

int donamelevel(void)

{
  char local_198 [8];
  char buf [256];
  char query [128];
  
  if (level->levname[0] == '\0') {
    sprintf(buf + 0xf8,"What do you want to call this dungeon level?");
  }
  else {
    sprintf(buf + 0xf8,"Replace previous name \"%s\" with?",level);
  }
  getlin(buf + 0xf8,local_198);
  if (local_198[0] != '\x1b') {
    strncpy(level->levname,local_198,0x3f);
    level->levname[0x3f] = '\0';
  }
  return 0;
}

Assistant:

int donamelevel(void)
{
	char query[QBUFSZ], buf[BUFSZ];

	if (level->levname[0])
		sprintf(query, "Replace previous name \"%s\" with?", level->levname);
	else
		sprintf(query,"What do you want to call this dungeon level?");
	getlin(query, buf);

	if (buf[0] == '\033')
	    return 0;

	strncpy(level->levname, buf, sizeof(level->levname)-1);
	level->levname[sizeof(level->levname)-1] = '\0';
	return 0;
}